

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

char * leveldb_env_get_test_directory(leveldb_env_t *env)

{
  size_t __n;
  char *__dest;
  undefined1 *puVar1;
  string result;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  void *local_28;
  
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  (*env->rep->_vptr_Env[0x13])(&local_28,env->rep,&local_48);
  __n = local_40;
  if (local_28 == (void *)0x0) {
    __dest = (char *)malloc(local_40 + 1);
    puVar1 = local_48;
    memcpy(__dest,local_48,__n);
    __dest[__n] = '\0';
  }
  else {
    operator_delete__(local_28);
    __dest = (char *)0x0;
    puVar1 = local_48;
  }
  if (puVar1 != local_38) {
    operator_delete(puVar1);
  }
  return __dest;
}

Assistant:

char* leveldb_env_get_test_directory(leveldb_env_t* env) {
  std::string result;
  if (!env->rep->GetTestDirectory(&result).ok()) {
    return nullptr;
  }

  char* buffer = static_cast<char*>(malloc(result.size() + 1));
  std::memcpy(buffer, result.data(), result.size());
  buffer[result.size()] = '\0';
  return buffer;
}